

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf-parser.cc
# Opt level: O0

string * __thiscall
elf_parser::Elf_parser::get_rel_symbol_name_abi_cxx11_
          (string *__return_storage_ptr__,Elf_parser *this,uint64_t *sym_idx,
          vector<elf_parser::symbol_t,_std::allocator<elf_parser::symbol_t>_> *syms)

{
  bool bVar1;
  reference paVar2;
  anon_struct_208_9_02e3cb33 *sym;
  iterator __end1;
  iterator __begin1;
  vector<elf_parser::symbol_t,_std::allocator<elf_parser::symbol_t>_> *__range1;
  vector<elf_parser::symbol_t,_std::allocator<elf_parser::symbol_t>_> *syms_local;
  uint64_t *sym_idx_local;
  Elf_parser *this_local;
  string *sym_name;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __end1 = std::vector<elf_parser::symbol_t,_std::allocator<elf_parser::symbol_t>_>::begin(syms);
  sym = (anon_struct_208_9_02e3cb33 *)
        std::vector<elf_parser::symbol_t,_std::allocator<elf_parser::symbol_t>_>::end(syms);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<elf_parser::symbol_t_*,_std::vector<elf_parser::symbol_t,_std::allocator<elf_parser::symbol_t>_>_>
                                *)&sym);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
    paVar2 = __gnu_cxx::
             __normal_iterator<elf_parser::symbol_t_*,_std::vector<elf_parser::symbol_t,_std::allocator<elf_parser::symbol_t>_>_>
             ::operator*(&__end1);
    if ((long)paVar2->symbol_num == *sym_idx >> 0x20) break;
    __gnu_cxx::
    __normal_iterator<elf_parser::symbol_t_*,_std::vector<elf_parser::symbol_t,_std::allocator<elf_parser::symbol_t>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&paVar2->symbol_name);
  return __return_storage_ptr__;
}

Assistant:

std::string Elf_parser::get_rel_symbol_name(
                uint64_t &sym_idx, std::vector<symbol_t> &syms) {

    std::string sym_name;
    for(auto &sym: syms) {
        if(sym.symbol_num == ELF64_R_SYM(sym_idx)) {
            sym_name = sym.symbol_name;
            break;
        }
    }
    return sym_name;
}